

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::rotL(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  byte bVar2;
  type value;
  int iVar3;
  uintptr_t uVar4;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar3 = (int)uVar1;
  if (iVar3 == 3) {
    uVar1 = (this->field_0).func.super_IString.str._M_len;
    bVar2 = (other->field_0).v128[0] & 0x3f;
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len =
         uVar1 << bVar2 | uVar1 >> 0x40 - bVar2;
    uVar4 = 3;
  }
  else {
    if (iVar3 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x592);
    }
    bVar2 = (other->field_0).v128[0] & 0x1f;
    (__return_storage_ptr__->field_0).i32 =
         (this->field_0).i32 << bVar2 | (uint)(this->field_0).i32 >> 0x20 - bVar2;
    uVar4 = 2;
  }
  (__return_storage_ptr__->type).id = uVar4;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::rotL(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(Bits::rotateLeft(uint32_t(i32), uint32_t(other.i32)));
    case Type::i64:
      return Literal(Bits::rotateLeft(uint64_t(i64), uint64_t(other.i64)));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}